

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O0

void __thiscall RunContext::Run(RunContext *this)

{
  BaseNode *pBVar1;
  bool bVar2;
  uint uVar3;
  vector<Connection,_std::allocator<Connection>_> *this_00;
  reference this_01;
  reference ppBVar4;
  BaseNode *node_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<BaseNode_*,_std::allocator<BaseNode_*>_> *__range1_1;
  Connection *c;
  iterator __end2;
  iterator __begin2;
  vector<Connection,_std::allocator<Connection>_> *__range2;
  BaseNode *node;
  iterator __end1;
  iterator __begin1;
  vector<BaseNode_*,_std::allocator<BaseNode_*>_> *__range1;
  RunContext *this_local;
  
  Pipeline::Clear(&this->pipeline);
  __end1 = std::vector<BaseNode_*,_std::allocator<BaseNode_*>_>::begin(&nodes);
  node = (BaseNode *)std::vector<BaseNode_*,_std::allocator<BaseNode_*>_>::end(&nodes);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<BaseNode_**,_std::vector<BaseNode_*,_std::allocator<BaseNode_*>_>_>
                                *)&node);
    if (!bVar2) {
      __end1_1 = std::vector<BaseNode_*,_std::allocator<BaseNode_*>_>::begin(&nodes);
      node_1 = (BaseNode *)std::vector<BaseNode_*,_std::allocator<BaseNode_*>_>::end(&nodes);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<BaseNode_**,_std::vector<BaseNode_*,_std::allocator<BaseNode_*>_>_>
                            *)&node_1);
        if (!bVar2) {
          Pipeline::Launch(&this->pipeline);
          return;
        }
        ppBVar4 = __gnu_cxx::
                  __normal_iterator<BaseNode_**,_std::vector<BaseNode_*,_std::allocator<BaseNode_*>_>_>
                  ::operator*(&__end1_1);
        uVar3 = (*(*ppBVar4)->_vptr_BaseNode[4])(*ppBVar4,this);
        if ((uVar3 & 1) == 0) break;
        __gnu_cxx::
        __normal_iterator<BaseNode_**,_std::vector<BaseNode_*,_std::allocator<BaseNode_*>_>_>::
        operator++(&__end1_1);
      }
      return;
    }
    ppBVar4 = __gnu_cxx::
              __normal_iterator<BaseNode_**,_std::vector<BaseNode_*,_std::allocator<BaseNode_*>_>_>
              ::operator*(&__end1);
    pBVar1 = *ppBVar4;
    this_00 = &pBVar1->connections;
    __end2 = std::vector<Connection,_std::allocator<Connection>_>::begin(this_00);
    c = (Connection *)std::vector<Connection,_std::allocator<Connection>_>::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>
                                       *)&c), bVar2) {
      this_01 = __gnu_cxx::
                __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>
                ::operator*(&__end2);
      if (((BaseNode *)this_01->output_node == pBVar1) &&
         (bVar2 = Connection::Prepare(this_01,this), !bVar2)) {
        return;
      }
      __gnu_cxx::
      __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::__normal_iterator<BaseNode_**,_std::vector<BaseNode_*,_std::allocator<BaseNode_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void RunContext::Run()
{
    pipeline.Clear();

    for (auto node : nodes)
    {
        for (auto& c : node->connections)
        {
            if (c.output_node != node)
                continue;
            if (!c.Prepare(*this))
            {
                return;
            }
        }
    }

    for (auto node : nodes)
    {
        if (!node->Prepare(*this))
        {
            return;
        }
    }

    pipeline.Launch();
}